

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGen_X86.cpp
# Opt level: O0

x86Reg __thiscall
CodeGenGenericContext::FindRegAtMemory
          (CodeGenGenericContext *this,x86Size size,x86Reg index,int multiplier,x86Reg base,
          uint shift,bool checkRegisters)

{
  bool bVar1;
  uint uVar2;
  x86Reg local_58;
  uint i;
  uint memIndex;
  x86Argument newArg;
  x86Reg xStack_28;
  bool checkRegisters_local;
  uint shift_local;
  x86Reg base_local;
  int multiplier_local;
  x86Reg index_local;
  x86Size size_local;
  CodeGenGenericContext *this_local;
  
  newArg.ptrMult._3_1_ = checkRegisters;
  newArg.ptrNum = shift;
  xStack_28 = base;
  shift_local = multiplier;
  base_local = index;
  multiplier_local = size;
  _index_local = this;
  RedirectAddressComputation
            (this,&base_local,(int *)&shift_local,&stack0xffffffffffffffd8,(uint *)&newArg.ptrNum);
  x86Argument::x86Argument
            ((x86Argument *)&i,multiplier_local,base_local,shift_local,xStack_28,newArg.ptrNum);
  uVar2 = MemFind(this,(x86Argument *)&i);
  if ((uVar2 == 0) || (this->memCache[uVar2 - 1].value.type != argReg)) {
    if ((newArg.ptrMult._3_1_ & 1) != 0) {
      for (local_58 = rNONE; local_58 < rRegCount; local_58 = local_58 + rEAX) {
        if ((this->genReg[local_58].type == argPtr) &&
           (bVar1 = x86Argument::operator==(this->genReg + local_58,(x86Argument *)&i), bVar1)) {
          return local_58;
        }
      }
    }
    this_local._4_4_ = rRegCount;
  }
  else {
    this_local._4_4_ = this->memCache[uVar2 - 1].value.field_1.reg;
  }
  return this_local._4_4_;
}

Assistant:

x86Reg CodeGenGenericContext::FindRegAtMemory(x86Size size, x86Reg index, int multiplier, x86Reg base, unsigned shift, bool checkRegisters)
{
#ifdef NULLC_OPTIMIZE_X86
	RedirectAddressComputation(index, multiplier, base, shift);

	x86Argument newArg = x86Argument(size, index, multiplier, base, shift);

	if(unsigned memIndex = MemFind(newArg))
	{
		memIndex--;

		if(memCache[memIndex].value.type == x86Argument::argReg)
			return memCache[memIndex].value.reg;
	}

	if(checkRegisters)
	{
		// If another register contains data from memory
		for(unsigned i = 0; i < rRegCount; i++)
		{
			if(genReg[i].type == x86Argument::argPtr && genReg[i] == newArg)
				return (x86Reg)i;
		}
	}
#endif

	return rRegCount;
}